

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::ConditionalCase::~ConditionalCase(ConditionalCase *this)

{
  ConditionalCase *this_local;
  
  ~ConditionalCase(this);
  operator_delete(this,0x1f0);
  return;
}

Assistant:

ConditionalCase::~ConditionalCase (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_arrayBuffer != 0)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}
}